

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* pbrt::SplitString_abi_cxx11_(string_view str,char ch)

{
  bool bVar1;
  allocator<char> *paVar2;
  allocator<char> in_CL;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  iterator end;
  iterator begin;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *strings;
  value_type *in_stack_ffffffffffffff58;
  allocator<char> *this;
  allocator<char> *__a;
  allocator<char> *__beg;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 uVar3;
  allocator<char> local_51;
  string local_50 [32];
  allocator<char> *local_30;
  allocator<char> *local_28;
  undefined1 local_1a;
  allocator<char> local_19;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  local_1a = 0;
  local_19 = in_CL;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x932d62);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18);
  if (!bVar1) {
    local_28 = (allocator<char> *)
               std::basic_string_view<char,_std::char_traits<char>_>::begin(&local_18);
    while( true ) {
      local_30 = local_28;
      while( true ) {
        __beg = local_30;
        paVar2 = (allocator<char> *)
                 std::basic_string_view<char,_std::char_traits<char>_>::end(&local_18);
        uVar3 = false;
        if (__beg != paVar2) {
          uVar3 = *local_30 != local_19;
        }
        if ((bool)uVar3 == false) break;
        local_30 = local_30 + 1;
      }
      paVar2 = &local_51;
      this = local_28;
      __a = local_30;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<char_const*,void>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uVar3,in_stack_ffffffffffffff80),(char *)__beg,(char *)paVar2,__a);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this,in_stack_ffffffffffffff58);
      std::__cxx11::string::~string(local_50);
      std::allocator<char>::~allocator(&local_51);
      if (*local_30 != local_19) break;
      local_28 = local_30 + 1;
    }
  }
  return in_RDI;
}

Assistant:

std::vector<std::string> SplitString(std::string_view str, char ch) {
    std::vector<std::string> strings;

    if (str.empty())
        return strings;

    std::string_view::iterator begin = str.begin();
    while (true) {
        std::string_view::iterator end = begin;
        while (end != str.end() && *end != ch)
            ++end;

        strings.push_back(std::string(begin, end));
        begin = end;

        if (*begin == ch)
            ++begin;
        else
            break;
    }

    return strings;
}